

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (quadratic_cost_type<long_double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  longdouble *plVar1;
  pointer ppVar2;
  quadratic_cost_type<long_double> *this_00;
  pointer ppVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  undefined8 extraout_RAX;
  pointer in_RCX;
  long lVar7;
  pointer ppVar8;
  pointer ppVar9;
  pointer ppVar10;
  pointer ppVar11;
  baryonyx *this_01;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__urng;
  int iVar12;
  long in_R8;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_long_double>
  __aurng;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar14;
  vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> r;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
  q;
  allocator_type local_85;
  longdouble local_84;
  vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> local_78;
  longdouble local_60;
  int local_54;
  quadratic_cost_type<long_double> *local_50;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
  local_48;
  
  std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::vector
            (&local_78,(long)n,(allocator_type *)&local_48);
  ppVar10 = (pointer)(long)(this->indices)._M_t.
                           super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                           super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
  ::vector(&local_48,(size_type)ppVar10,&local_85);
  ppVar11 = local_78.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (n != 0) {
    plVar1 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
    ppVar10 = (pointer)0x0;
    iVar12 = 0;
    do {
      *(unkbyte10 *)
       ((long)&(local_78.
                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first + (long)ppVar10 * 2) =
           *(unkbyte10 *)((long)ppVar10 + (long)plVar1);
      *(int *)((long)&(local_78.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->second + (long)ppVar10 * 2) =
           iVar12;
      iVar12 = iVar12 + 1;
      ppVar10 = (pointer)((long)ppVar10 + 0x10);
      in_RCX = local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while ((pointer)((ulong)(uint)n << 4) != ppVar10);
  }
  ppVar2 = local_78.
           super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = local_78.
           super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar12 = n;
  this_00 = this;
  if (local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_54 = n;
    local_50 = this;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_78.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              ();
    ppVar10 = ppVar11;
    ppVar2 = local_78.
             super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar9 = local_78.
             super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar11 = local_78.
              super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    iVar12 = local_54;
    this_00 = local_50;
  }
  for (; ppVar3 = local_78.
                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, local_54 = iVar12, local_50 = this_00,
      ppVar2 != local_78.
                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
    lVar13 = ppVar2->first;
    local_84 = ppVar9->first;
    in_ST5 = in_ST4;
    if (((lVar13 != local_84) ||
        (ppVar8 = ppVar9,
        local_78.
        super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar11, NAN(lVar13) || NAN(local_84))) &&
       (in_RCX = (pointer)CONCAT71((int7)((ulong)in_RCX >> 8),ppVar2 == ppVar9), ppVar8 = ppVar2,
       local_78.
       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish = ppVar11, 0x20 < (long)ppVar2 - (long)ppVar9)) {
      local_60 = lVar13 - local_84;
      lVar13 = in_ST0;
      lVar14 = in_ST1;
      lVar4 = in_ST2;
      lVar5 = in_ST3;
      lVar6 = in_ST4;
      do {
        in_ST4 = in_ST5;
        in_ST3 = lVar6;
        in_ST2 = lVar5;
        in_ST1 = lVar4;
        in_ST0 = lVar14;
        in_ST5 = in_ST4;
        std::
        generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                  ((longdouble *)rng,
                   (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)ppVar10)
        ;
        ppVar9->first = local_84 + local_60 * lVar13;
        ppVar9 = ppVar9 + 1;
        lVar13 = in_ST0;
        lVar14 = in_ST1;
        lVar4 = in_ST2;
        lVar5 = in_ST3;
        lVar6 = in_ST4;
      } while (ppVar9 != ppVar2);
    }
    ppVar9 = ppVar8;
    ppVar11 = local_78.
              super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    iVar12 = local_54;
    this_00 = local_50;
    local_78.
    super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar3;
  }
  if (0x20 < (long)local_78.
                   super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9) {
    if ((long)ppVar9 -
        (long)local_78.
              super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      local_84 = ppVar9->first;
      lVar13 = (longdouble)1 + local_84;
      if ((local_84 == lVar13) && (!NAN(local_84) && !NAN(lVar13))) goto LAB_001b4582;
      if (ppVar9 != local_78.
                    super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        local_60 = lVar13 - local_84;
        __urng = (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x0;
        lVar13 = in_ST4;
        local_78.
        super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar11;
        do {
          lVar14 = lVar13;
          std::
          generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    ((longdouble *)rng,__urng);
          ppVar9->first = local_84 + local_60 * in_ST0;
          ppVar9 = ppVar9 + 1;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = lVar13;
          lVar13 = lVar14;
          ppVar11 = local_78.
                    super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar9 != ppVar3);
      }
    }
    else {
      this_01 = (baryonyx *)
                ((long)ppVar9 -
                 (long)local_78.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar11;
      linearize<long,long_double>
                ((longdouble *)0x0,this_01,
                 (long)ppVar11 -
                 (long)local_78.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,
                 (local_78.
                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first,(long)in_RCX,ppVar9->first,in_R8
                );
      local_84 = ppVar9->first;
      if ((local_84 == in_ST0) && (!NAN(local_84) && !NAN(in_ST0))) {
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
LAB_001b4582:
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
        if (local_78.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(extraout_RAX);
      }
      ppVar11 = local_78.
                super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar9 != ppVar3) {
        local_60 = in_ST0 - local_84;
        lVar13 = in_ST5;
        do {
          lVar14 = lVar13;
          std::
          generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    ((longdouble *)rng,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     this_01);
          ppVar9->first = local_84 + local_60 * in_ST1;
          ppVar9 = ppVar9 + 1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = lVar13;
          lVar13 = lVar14;
          ppVar11 = local_78.
                    super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar9 != ppVar3);
      }
    }
  }
  local_78.
  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppVar11;
  ppVar10 = local_78.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_78.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_78.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (ppVar10,local_78.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (iVar12 != 0) {
    plVar1 = (this_00->linear_elements)._M_t.
             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
             super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
    lVar7 = 0;
    do {
      *(unkbyte10 *)((long)plVar1 + lVar7) =
           *(unkbyte10 *)
            ((long)&(local_78.
                     super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar7 * 2);
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar7);
  }
  make_loo_norm(this_00,iVar12);
  if (local_48.
      super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.
      super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);
        std::vector<std::pair<quad, int>> q(indices[n]);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        {
            auto begin = r.begin();
            auto end = r.end();
            auto next = r.begin()++;
            for (; next != end; ++next) {
                if (next->first != begin->first) {
                    if (std::distance(begin, next) > 1)
                        random_epsilon_unique(
                          begin, next, rng, begin->first, next->first);

                    begin = next;
                }
            }

            if (std::distance(begin, end) > 1) {
                if (begin == r.begin()) {
                    random_epsilon_unique(
                      begin, end, rng, begin->first, begin->first + 1);
                } else {
                    auto value = linearize(std::ptrdiff_t(0),
                                           r.front().first,
                                           std::distance(r.begin(), begin),
                                           begin->first,
                                           std::distance(r.begin(), r.end()));

                    random_epsilon_unique(
                      begin, end, rng, begin->first, value);
                }
            }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            std::sort(
              r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
                  return lhs.second < rhs.second;
              });
        }

        {
            // auto begin = q.begin();
            // auto end = q.end();
            // auto next = q.begin()++;
            // for (; next != end; ++next) {
            //     if (next->first != begin->first) {
            //         if (std::distance(begin, next) > 1)
            //             random_epsilon_unique(
            //               begin, next, rng, begin->first,
            //               next->first);

            //         begin = next;
            //     }
            // }

            // if (std::distance(begin, end) > 1) {
            //     if (begin == q.begin()) {
            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, begin->first +
            //           1);
            //     } else {
            //         auto value = linearize(std::ptrdiff_t(0),
            //                                q.front().first,
            //                                std::distance(q.begin(),
            //                                begin), begin->first,
            //                                std::distance(q.begin(),
            //                                q.end()));

            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, value);
            //     }
            // }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            // std::sort(
            //   q.begin(), q.end(), [](const auto& lhs, const auto&
            //   rhs) {
            //       return lhs.second < rhs.second;
            //   });
        }

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;
        // for (int i = 0; i != n; ++i) {
        //     quadratic_elements[i].factor = r[i].first.factor;

        // Finally we compute the l+oo norm.
        make_loo_norm(n);
    }